

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O0

void __thiscall
xLearn::DMATRIX_TEST_Compress_Test::~DMATRIX_TEST_Compress_Test(DMATRIX_TEST_Compress_Test *this)

{
  void *in_RDI;
  
  ~DMATRIX_TEST_Compress_Test((DMATRIX_TEST_Compress_Test *)0x15c928);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DMATRIX_TEST, Compress) {
  // Init matrix
  DMatrix matrix;
  matrix.Reset();
  // row_0
  matrix.AddRow();
  matrix.AddNode(0, 1, 0.1);
  matrix.AddNode(0, 5, 0.1);
  matrix.AddNode(0, 8, 0.1);
  matrix.AddNode(0, 10, 0.1);
  // row_1
  matrix.AddRow();
  matrix.AddNode(1, 3, 0.1);
  matrix.AddNode(1, 12, 0.1);
  matrix.AddNode(1, 20, 0.1);
  // row_2
  matrix.AddRow();
  matrix.AddNode(2, 5, 0.1);
  matrix.AddNode(2, 8, 0.1);
  matrix.AddNode(2, 11, 0.1);
  // row_3
  matrix.AddRow();
  matrix.AddNode(3, 2, 0.1);
  matrix.AddNode(3, 4, 0.1);
  matrix.AddNode(3, 7, 0.1);
  // Compress
  std::vector<index_t> feature_list;
  matrix.Compress(feature_list);
  // row_0
  SparseRow* row = matrix.row[0];
  EXPECT_EQ((*row)[0].feat_id, 1);
  EXPECT_EQ((*row)[1].feat_id, 5);
  EXPECT_EQ((*row)[2].feat_id, 7);
  EXPECT_EQ((*row)[3].feat_id, 8);
  // row_1
  row = matrix.row[1];
  EXPECT_EQ((*row)[0].feat_id, 3);
  EXPECT_EQ((*row)[1].feat_id, 10);
  EXPECT_EQ((*row)[2].feat_id, 11);
  // row_2
  row = matrix.row[2];
  EXPECT_EQ((*row)[0].feat_id, 5);
  EXPECT_EQ((*row)[1].feat_id, 7);
  EXPECT_EQ((*row)[2].feat_id, 9);
  // row_3
  row = matrix.row[3];
  EXPECT_EQ((*row)[0].feat_id, 2);
  EXPECT_EQ((*row)[1].feat_id, 4);
  EXPECT_EQ((*row)[2].feat_id, 6);
  // feature list
  EXPECT_EQ(feature_list[0], 1);
  EXPECT_EQ(feature_list[1], 2);
  EXPECT_EQ(feature_list[2], 3);
  EXPECT_EQ(feature_list[3], 4);
  EXPECT_EQ(feature_list[4], 5);
  EXPECT_EQ(feature_list[5], 7);
  EXPECT_EQ(feature_list[6], 8);
  EXPECT_EQ(feature_list[7], 10);
  EXPECT_EQ(feature_list[8], 11);
  EXPECT_EQ(feature_list[9], 12);
  EXPECT_EQ(feature_list[10], 20);
}